

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVec2 *p;
  double *pdVar1;
  double dVar2;
  short sVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  uint uVar9;
  ImVec2 IVar10;
  ImGuiWindow *pIVar11;
  byte bVar12;
  int iVar13;
  bool bVar14;
  int iVar15;
  ImGuiViewportP *pIVar16;
  byte bVar17;
  byte bVar18;
  ulong uVar19;
  ImGuiWindow *pIVar20;
  ulong uVar21;
  ImGuiWindow *pIVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ImRect local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pIVar7 = GImGui;
  pIVar11 = GImGui->MovingWindow;
  if (pIVar11 == (ImGuiWindow *)0x0) {
    pIVar16 = (ImGuiViewportP *)0x0;
    pIVar20 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar16 = pIVar11->Viewport;
    pIVar11->Viewport = GImGui->MouseViewport;
    pIVar20 = (ImGuiWindow *)0x0;
    if ((pIVar11->Flags & 0x200) == 0) {
      pIVar20 = pIVar11;
    }
  }
  IVar10 = (pIVar7->Style).TouchExtraPadding;
  auVar29._8_8_ = 0;
  auVar29._0_4_ = IVar10.x;
  auVar29._4_4_ = IVar10.y;
  if ((pIVar7->IO).ConfigWindowsResizeFromEdges == true) {
    auVar24 = maxps(auVar29,_DAT_002002c0);
    IVar10 = auVar24._0_8_;
  }
  auVar24._8_8_ = 0;
  auVar24._0_4_ = IVar10.x;
  auVar24._4_4_ = IVar10.y;
  uVar21 = (ulong)(uint)(pIVar7->Windows).Size;
  p = &(pIVar7->IO).MousePos;
  pIVar11 = (ImGuiWindow *)0x0;
LAB_00146dc4:
  do {
    uVar19 = uVar21 & 0xffffffff;
    while( true ) {
      uVar21 = uVar21 - 1;
      if ((int)uVar19 < 1) {
        pIVar7->HoveredWindow = pIVar20;
        if (pIVar20 != (ImGuiWindow *)0x0) goto LAB_00146f64;
        pIVar20 = (ImGuiWindow *)0x0;
        pIVar22 = (ImGuiWindow *)0x0;
        goto LAB_00146f74;
      }
      pIVar22 = (pIVar7->Windows).Data[uVar21];
      if ((((pIVar22->Active == true) && (pIVar22->Hidden == false)) &&
          ((pIVar22->Flags & 0x200) == 0)) && (pIVar22->Viewport == pIVar7->MouseViewport)) break;
      uVar19 = (ulong)((int)uVar19 - 1);
    }
    IVar10 = (pIVar22->OuterRectClipped).Min;
    IVar6 = (pIVar22->OuterRectClipped).Max;
    uVar9 = (uint)((pIVar22->Flags & 0x1000042U) == 0);
    auVar25._0_4_ = (int)(uVar9 << 0x1f) >> 0x1f;
    auVar25._4_4_ = (int)(uVar9 << 0x1f) >> 0x1f;
    auVar25._8_8_ = 0;
    auVar26 = ~auVar25 & auVar29 | auVar24 & auVar25;
    fVar27 = auVar26._0_4_;
    fVar23 = auVar26._4_4_;
    auVar4._4_8_ = SUB168(auVar24 & auVar25,8);
    auVar4._0_4_ = fVar23;
    auVar26._0_8_ = auVar4._0_8_ << 0x20;
    auVar26._8_4_ = fVar27;
    auVar26._12_4_ = fVar23;
    local_68.Min.x = IVar10.x;
    local_68.Min.y = IVar10.y;
    local_68.Max.x = IVar6.x;
    local_68.Max.y = IVar6.y;
    auVar5._4_8_ = auVar26._8_8_;
    auVar5._0_4_ = fVar23 + local_68.Min.y;
    auVar28._0_8_ = auVar5._0_8_ << 0x20;
    auVar28._8_4_ = fVar27 + local_68.Max.x;
    auVar28._12_4_ = fVar23 + local_68.Max.y;
    local_68.Min.x = local_68.Min.x - fVar27;
    local_68.Min.y = local_68.Min.y - fVar23;
    local_68.Max = auVar28._8_8_;
    local_58 = auVar24;
    local_48 = auVar29;
    bVar8 = ImRect::Contains(&local_68,p);
    auVar24 = local_58;
    auVar29 = local_48;
  } while (!bVar8);
  sVar3 = (pIVar22->HitTestHoleSize).x;
  if (sVar3 != 0) {
    iVar13 = (int)(pIVar22->HitTestHoleOffset).x;
    fVar27 = p->x - (pIVar22->Pos).x;
    if ((float)iVar13 <= fVar27) goto LAB_00146ef6;
  }
  goto LAB_00146e9c;
LAB_00146ef6:
  iVar15 = (int)(pIVar22->HitTestHoleOffset).y;
  fVar23 = (pIVar7->IO).MousePos.y - (pIVar22->Pos).y;
  if (((fVar23 < (float)iVar15) || ((float)(iVar13 + sVar3) <= fVar27)) ||
     ((float)((pIVar22->HitTestHoleSize).y + iVar15) <= fVar23)) {
LAB_00146e9c:
    if (pIVar20 == (ImGuiWindow *)0x0) {
      pIVar20 = pIVar22;
    }
    if (((pIVar11 == (ImGuiWindow *)0x0) &&
        (pIVar11 = pIVar22, pIVar7->MovingWindow != (ImGuiWindow *)0x0)) &&
       (pIVar22->RootWindow == pIVar7->MovingWindow->RootWindow)) {
      pIVar11 = (ImGuiWindow *)0x0;
    }
    else {
      if (pIVar20 != (ImGuiWindow *)0x0) {
        pIVar7->HoveredWindow = pIVar20;
LAB_00146f64:
        pIVar22 = pIVar20->RootWindow;
LAB_00146f74:
        pIVar7->HoveredRootWindow = pIVar22;
        pIVar7->HoveredWindowUnderMovingWindow = pIVar11;
        if (pIVar7->MovingWindow != (ImGuiWindow *)0x0) {
          pIVar7->MovingWindow->Viewport = pIVar16;
        }
        pIVar11 = GetTopMostPopupModal();
        if (((pIVar11 != (ImGuiWindow *)0x0) && (pIVar22 != (ImGuiWindow *)0x0)) &&
           (bVar8 = IsWindowChildOf(pIVar22,pIVar11), !bVar8)) {
          pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
          pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
          pIVar7->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
          pIVar20 = (ImGuiWindow *)0x0;
        }
        uVar9 = (pIVar7->IO).ConfigFlags;
        if ((uVar9 & 0x10) != 0) {
          pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
          pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
          pIVar7->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
          pIVar20 = (ImGuiWindow *)0x0;
        }
        uVar21 = 0xffffffffffffffff;
        uVar19 = 0;
        bVar12 = 0;
        while( true ) {
          iVar13 = (int)uVar21;
          if (uVar19 == 5) break;
          if ((pIVar7->IO).MouseClicked[uVar19] == true) {
            bVar8 = true;
            if (pIVar20 == (ImGuiWindow *)0x0) {
              bVar8 = (pIVar7->OpenPopupStack).Size != 0;
            }
            (pIVar7->IO).MouseDownOwned[uVar19] = bVar8;
          }
          bVar8 = (pIVar7->IO).MouseDown[uVar19];
          if ((bVar8 == true) &&
             ((iVar13 == -1 ||
              (dVar2 = (pIVar7->IO).MouseClickedTime[iVar13],
              pdVar1 = (pIVar7->IO).MouseClickedTime + uVar19, *pdVar1 <= dVar2 && dVar2 != *pdVar1)
              ))) {
            uVar21 = uVar19 & 0xffffffff;
          }
          bVar12 = bVar12 & 1 | bVar8;
          uVar19 = uVar19 + 1;
        }
        if (iVar13 == -1) {
          bVar17 = 1;
        }
        else {
          bVar17 = (pIVar7->IO).MouseDownOwned[iVar13];
        }
        if (pIVar7->DragDropActive == true) {
          bVar18 = ((byte)pIVar7->DragDropSourceFlags & 0x10) >> 4;
        }
        else {
          bVar18 = 0;
        }
        if (bVar18 == 0 && (bVar17 & 1) == 0) {
          pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
          pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
          pIVar7->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
          pIVar20 = (ImGuiWindow *)0x0;
        }
        if (pIVar7->WantCaptureMouseNextFrame == -1) {
          bVar8 = true;
          if ((bVar17 & (pIVar20 != (ImGuiWindow *)0x0 | bVar12)) == 0) {
            bVar8 = (pIVar7->OpenPopupStack).Size != 0;
          }
          (pIVar7->IO).WantCaptureMouse = bVar8;
        }
        else {
          (pIVar7->IO).WantCaptureMouse = pIVar7->WantCaptureMouseNextFrame != 0;
        }
        if (pIVar7->WantCaptureKeyboardNextFrame == -1) {
          bVar8 = pIVar7->ActiveId != 0 || pIVar11 != (ImGuiWindow *)0x0;
        }
        else {
          bVar8 = pIVar7->WantCaptureKeyboardNextFrame != 0;
        }
        bVar14 = true;
        if ((pIVar7->IO).NavActive == false) {
          bVar14 = bVar8;
        }
        if ((uVar9 & 9) != 1) {
          bVar14 = bVar8;
        }
        (pIVar7->IO).WantCaptureKeyboard = bVar14;
        (pIVar7->IO).WantTextInput = pIVar7->WantTextInputNextFrame - 1U < 0xfffffffe;
        return;
      }
      pIVar20 = (ImGuiWindow *)0x0;
    }
  }
  goto LAB_00146dc4;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    FindHoveredWindow();
    IM_ASSERT(g.HoveredWindow == NULL || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport);

    // Modal windows prevents cursor from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window)
        if (g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
            g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (!g.OpenPopupStack.empty());
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (!g.OpenPopupStack.empty());

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}